

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void detail::AppendCustomCommandToOutput
               (cmLocalGenerator *lg,cmListFileBacktrace *lfbt,string *output,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *depends,cmImplicitDependsList *implicit_depends,cmCustomCommandLines *commandLines)

{
  cmake *this;
  size_type sVar1;
  cmSourceFile *this_00;
  cmCustomCommand *this_01;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  sVar1 = cmGeneratorExpression::Find(output);
  if (sVar1 == 0xffffffffffffffff) {
    this_00 = cmLocalGenerator::GetSourceFileWithOutput(lg,output,OutputOnly);
  }
  else {
    cmLocalGenerator::ExpandCustomCommandOutputGenex
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_90,lg,output,lfbt);
    do {
      this_00 = (cmSourceFile *)0x0;
      if ((char *)local_90.View_._M_len == local_90.View_._M_str) break;
      this_00 = cmLocalGenerator::GetSourceFileWithOutput
                          (lg,(string *)local_90.View_._M_len,OutputOnly);
      local_90.View_._M_len = local_90.View_._M_len + 0x20;
    } while (this_00 == (cmSourceFile *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_90);
  }
  if ((this_00 == (cmSourceFile *)0x0) ||
     (this_01 = cmSourceFile::GetCustomCommand(this_00), this_01 == (cmCustomCommand *)0x0)) {
    this = lg->GlobalGenerator->CMakeInstance;
    local_90.View_._M_len = 0x32;
    local_90.View_._M_str = "Attempt to APPEND to custom command with output\n  ";
    local_60.View_._M_str = (output->_M_dataplus)._M_p;
    local_60.View_._M_len = output->_M_string_length;
    cmStrCat<char[47]>(&local_b0,&local_90,&local_60,
                       (char (*) [47])"\nwhich is not already a custom command output.");
    cmake::IssueMessage(this,FATAL_ERROR,&local_b0,lfbt);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    cmCustomCommand::AppendCommands(this_01,commandLines);
    cmCustomCommand::AppendDepends(this_01,depends);
    cmCustomCommand::AppendImplicitDepends(this_01,implicit_depends);
  }
  return;
}

Assistant:

void AppendCustomCommandToOutput(cmLocalGenerator& lg,
                                 const cmListFileBacktrace& lfbt,
                                 const std::string& output,
                                 const std::vector<std::string>& depends,
                                 const cmImplicitDependsList& implicit_depends,
                                 const cmCustomCommandLines& commandLines)
{
  // Lookup an existing command.
  cmSourceFile* sf = nullptr;
  if (cmGeneratorExpression::Find(output) == std::string::npos) {
    sf = lg.GetSourceFileWithOutput(output);
  } else {
    // This output path has a generator expression.  Evaluate it to
    // find the output for any configurations.
    for (std::string const& out :
         lg.ExpandCustomCommandOutputGenex(output, lfbt)) {
      sf = lg.GetSourceFileWithOutput(out);
      if (sf) {
        break;
      }
    }
  }

  if (sf) {
    if (cmCustomCommand* cc = sf->GetCustomCommand()) {
      cc->AppendCommands(commandLines);
      cc->AppendDepends(depends);
      cc->AppendImplicitDepends(implicit_depends);
      return;
    }
  }

  // No existing command found.
  lg.GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR,
    cmStrCat("Attempt to APPEND to custom command with output\n  ", output,
             "\nwhich is not already a custom command output."),
    lfbt);
}